

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mktime.c
# Opt level: O1

int main(void)

{
  time_t tVar1;
  tm time;
  tm local_38;
  
  local_38.tm_sec = 0x34;
  local_38.tm_min = 0x2d;
  local_38.tm_hour = 0x15;
  local_38.tm_mday = 0xd;
  local_38.tm_mon = 0xb;
  local_38.tm_year = 1;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = -1;
  tVar1 = mktime(&local_38);
  if (tVar1 != -0x80000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/mktime.c, line %d - %s\n"
           ,0x2c,"t == -2147483648l");
  }
  local_38.tm_sec = 7;
  local_38.tm_min = 0xe;
  local_38.tm_hour = 4;
  local_38.tm_mday = 0x13;
  local_38.tm_mon = 0;
  local_38.tm_year = 0x8a;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = -1;
  tVar1 = mktime(&local_38);
  if (tVar1 != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/time/mktime.c, line %d - %s\n"
           ,0x30,"t == 2147483647l");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* System Clock DST */
    struct tm time;
    time_t t;

    MKTIME( time, 52, 45, 21, 13, 11, 1, 0, 0 );
    t = mktime( &time );
    TESTCASE( t == -2147483648l );

    MKTIME( time, 7, 14, 4, 19, 0, 138, 0, 0 );
    t = mktime( &time );
    TESTCASE( t == 2147483647l );

    return TEST_RESULTS;
}